

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

size_t ckh_isearch(ckh_t *ckh,void *key)

{
  void *pvVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  size_t hashes [2];
  ulong local_38;
  ulong local_30;
  
  (*ckh->hash)(key,&local_38);
  local_38 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_38;
  lVar3 = local_38 << 6;
  lVar5 = 0;
  while ((pvVar1 = *(void **)((long)&ckh->tab->key + lVar3), pvVar1 == (void *)0x0 ||
         (_Var2 = (*ckh->keycomp)(key,pvVar1), !_Var2))) {
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0x10;
    if (lVar5 == 4) {
      sVar6 = 0xffffffffffffffff;
LAB_011ac6bb:
      if (sVar6 == 0xffffffffffffffff) {
        uVar4 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_30;
        lVar3 = uVar4 << 6;
        lVar5 = 0;
        do {
          pvVar1 = *(void **)((long)&ckh->tab->key + lVar3);
          if ((pvVar1 != (void *)0x0) && (_Var2 = (*ckh->keycomp)(key,pvVar1), _Var2)) {
            return uVar4 * 4 + lVar5;
          }
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar5 != 4);
        sVar6 = 0xffffffffffffffff;
      }
      return sVar6;
    }
  }
  sVar6 = local_38 * 4 + lVar5;
  goto LAB_011ac6bb;
}

Assistant:

static size_t
ckh_isearch(ckh_t *ckh, const void *key) {
	size_t hashes[2], bucket, cell;

	assert(ckh != NULL);

	ckh->hash(key, hashes);

	/* Search primary bucket. */
	bucket = hashes[0] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	if (cell != SIZE_T_MAX) {
		return cell;
	}

	/* Search secondary bucket. */
	bucket = hashes[1] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	return cell;
}